

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabbar.cpp
# Opt level: O2

void QTabBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  QSize *pQVar2;
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  QSize QVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      currentChanged((QTabBar *)_o,*_a[1]);
      return;
    case 1:
      tabCloseRequested((QTabBar *)_o,*_a[1]);
      return;
    case 2:
      tabMoved((QTabBar *)_o,*_a[1],*_a[2]);
      return;
    case 3:
      tabBarClicked((QTabBar *)_o,*_a[1]);
      return;
    case 4:
      tabBarDoubleClicked((QTabBar *)_o,*_a[1]);
      return;
    case 5:
      iVar9 = *_a[1];
      break;
    default:
      return;
    }
LAB_00452e3a:
    setCurrentIndex((QTabBar *)_o,iVar9);
    return;
  case ReadProperty:
    if (0xd < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (0xd < (uint)_id) {
      return;
    }
    pQVar2 = (QSize *)*_a;
    switch(_id) {
    case 0:
      setShape((QTabBar *)_o,(pQVar2->wd).m_i);
      return;
    case 1:
      iVar9 = (pQVar2->wd).m_i;
      goto LAB_00452e3a;
    case 2:
      return;
    case 3:
      setDrawBase((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    case 4:
      setIconSize((QTabBar *)_o,pQVar2);
      return;
    case 5:
      setElideMode((QTabBar *)_o,(pQVar2->wd).m_i);
      return;
    case 6:
      setUsesScrollButtons((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    case 7:
      setTabsClosable((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    case 8:
      *(int *)(*(long *)(_o + 8) + 0x2b0) = (pQVar2->wd).m_i;
      return;
    case 9:
      setExpanding((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    case 10:
      lVar7 = *(long *)(_o + 8);
      uVar5 = (ushort)(byte)(pQVar2->wd).m_i << 8;
      uVar8 = 0xfeff;
      break;
    case 0xb:
      lVar7 = *(long *)(_o + 8);
      uVar5 = (ushort)(byte)(pQVar2->wd).m_i << 10;
      uVar8 = 0xfbff;
      break;
    case 0xc:
      setAutoHide((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    case 0xd:
      setChangeCurrentOnDrag((QTabBar *)_o,SUB41((pQVar2->wd).m_i,0));
      return;
    }
    *(ushort *)(lVar7 + 0x2d0) = uVar8 & (ushort)*(undefined4 *)(lVar7 + 0x2d0) | uVar5;
    return;
  default:
    goto switchD_00452cb3_caseD_3;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                      ((QtMocHelpers *)_a,(void **)currentChanged,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                            ((QtMocHelpers *)_a,(void **)tabCloseRequested,0,1), !bVar3)) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int,int)>
                           ((QtMocHelpers *)_a,(void **)tabMoved,0,2), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                          ((QtMocHelpers *)_a,(void **)tabBarClicked,0,3), !bVar3)) {
      QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                ((QtMocHelpers *)_a,(void **)tabBarDoubleClicked,0,4);
      return;
    }
    goto switchD_00452cb3_caseD_3;
  }
  pQVar2 = (QSize *)*_a;
  switch(_id) {
  case 0:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2b4);
    break;
  case 1:
    iVar1 = *(int *)(*(long *)(_o + 8) + 700);
    if ((long)iVar1 < 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -1;
      if ((ulong)(long)iVar1 < *(ulong *)(*(long *)(_o + 8) + 0x2e8)) {
        iVar9 = iVar1;
      }
    }
    break;
  case 2:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2e8);
    break;
  case 3:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 1;
    goto LAB_00452f4c;
  case 4:
    QVar6 = iconSize((QTabBar *)_o);
    *pQVar2 = QVar6;
    return;
  case 5:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2ac);
    break;
  case 6:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 3;
    goto LAB_00452f4c;
  case 7:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 6;
    goto LAB_00452f4c;
  case 8:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2b0);
    break;
  case 9:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x2d0) >> 5;
    goto LAB_00452f4c;
  case 10:
    bVar4 = *(byte *)(*(long *)(_o + 8) + 0x2d1);
LAB_00452f4c:
    *(byte *)&(pQVar2->wd).m_i = bVar4 & 1;
    return;
  case 0xb:
    bVar4 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 10);
    goto LAB_00452f2d;
  case 0xc:
    bVar4 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xb);
    goto LAB_00452f2d;
  case 0xd:
    bVar4 = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x2d0) >> 0xc);
LAB_00452f2d:
    *(byte *)&(pQVar2->wd).m_i = bVar4 & 1;
    return;
  }
  (pQVar2->wd).m_i = iVar9;
switchD_00452cb3_caseD_3:
  return;
}

Assistant:

void QTabBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int , int )>(_a, &QTabBar::tabMoved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarClicked, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarDoubleClicked, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->shape(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->drawBase(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 8: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehaviorOnRemove(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->expanding(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoHide(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->changeCurrentOnDrag(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDrawBase(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setSelectionBehaviorOnRemove(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 9: _t->setExpanding(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setAutoHide(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setChangeCurrentOnDrag(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}